

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall despot::util::tinyxml::TiXmlAttribute::SetIntValue(TiXmlAttribute *this,int _value)

{
  size_t len;
  char buf [64];
  char acStack_58 [72];
  
  snprintf(acStack_58,0x40,"%d",_value);
  len = strlen(acStack_58);
  TiXmlString::assign(&this->value,acStack_58,len);
  return;
}

Assistant:

void TiXmlAttribute::SetIntValue(int _value) {
	char buf[64];
#if defined(TIXML_SNPRINTF)
	TIXML_SNPRINTF(buf, sizeof(buf), "%d", _value);
#else
	sprintf (buf, "%d", _value);
#endif
	SetValue(buf);
}